

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O2

void __thiscall FTexture::CalcBitSize(FTexture *this)

{
  byte bVar1;
  byte bVar2;
  
  bVar1 = 0xff;
  do {
    bVar1 = bVar1 + 1;
  } while (1 << (bVar1 & 0x1f) < (int)(uint)this->Width);
  bVar1 = bVar1 - ((int)(uint)this->Width < 1 << (bVar1 & 0x1f));
  this->WidthBits = bVar1;
  this->WidthMask = ~(ushort)(-1 << (bVar1 & 0x1f));
  bVar1 = 0;
  do {
    bVar2 = bVar1;
    bVar1 = bVar2 + 1;
  } while (1 << (bVar2 & 0x1f) < (int)(uint)this->Height);
  this->HeightBits = bVar2;
  return;
}

Assistant:

void FTexture::CalcBitSize ()
{
	// WidthBits is rounded down, and HeightBits is rounded up
	int i;

	for (i = 0; (1 << i) < Width; ++i)
	{ }

	WidthBits = i;

	// Having WidthBits that would allow for columns past the end of the
	// texture is not allowed, even if it means the entire texture is
	// not drawn.
	if (Width < (1 << WidthBits))
	{
		WidthBits--;
	}
	WidthMask = (1 << WidthBits) - 1;

	// <hr>The minimum height is 2, because we cannot shift right 32 bits.</hr>
	// Scratch that. Somebody actually made a 1x1 texture, so now we have to handle it.
	for (i = 0; (1 << i) < Height; ++i)
	{ }

	HeightBits = i;
}